

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_global.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::
MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/ellbvp_msh/ellbvp_msh_demo.cc:75:15)>
::operator()(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
            MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_ellbvp_msh_ellbvp_msh_demo_cc:75:15)>
            *this,Entity *e,MatrixXd *local)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  undefined8 uVar3;
  int iVar4;
  dim_t dVar5;
  undefined4 extraout_var;
  vector<double,_std::allocator<double>_> *extraout_RAX;
  PointerType ptr;
  long i;
  MatrixXd global_points;
  stringstream ss;
  assign_op<double,_double> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  iVar4 = (*this->_vptr_MeshFunctionGlobal[4])(this);
  dVar5 = base::internal::DimensionImpl((RefElType)iVar4);
  if (e[1]._vptr_Entity == (_func_int **)(ulong)dVar5) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              (__return_storage_ptr__,(size_type)e[2]._vptr_Entity);
    iVar4 = (*this->_vptr_MeshFunctionGlobal[3])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))
              (&local_218,(long *)CONCAT44(extraout_var,iVar4),e);
    if (0 < (long)e[2]._vptr_Entity) {
      i = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_218,i);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_1f8,
                   local_1b8._8_8_,1);
        uVar3 = local_1b8._0_8_;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                  ((Matrix<double,_2,_1,_0,_2,_1> *)&local_1f8,
                   (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1b8,
                   &local_219);
        local_1f8._M_dataplus._M_p = *(pointer *)uVar3;
        local_1f8._M_string_length = *(size_type *)(uVar3 + 8);
        local_1d8._M_dataplus._M_p = (pointer)0x0;
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,__position,(double *)&local_1d8);
        }
        else {
          *__position._M_current = 0.0;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        i = i + 1;
      } while (i < (long)e[2]._vptr_Entity);
    }
    free(local_218._M_dataplus._M_p);
    return extraout_RAX;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"mismatch between entity dimension and local.rows()",0x32
            );
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"e.RefEl().Dimension() == local.rows()","");
  paVar2 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_218,&local_1f8,0x50,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"false","");
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  base::AssertionFailed(&local_218,&local_1f8,0x50,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  abort();
}

Assistant:

std::vector<F_return_type> operator()(const mesh::Entity& e,
                                        const Eigen::MatrixXd& local) const {
    LF_ASSERT_MSG(e.RefEl().Dimension() == local.rows(),
                  "mismatch between entity dimension and local.rows()");
    std::vector<F_return_type> result;
    result.reserve(local.cols());
    auto global_points = e.Geometry()->Global(local);
    for (long i = 0; i < local.cols(); ++i) {
      result.push_back(f_(global_points.col(i)));
    }
    return result;
  }